

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawKeys(void)

{
  uint uVar1;
  AInventory *key;
  AMColor color;
  DVector3 pos;
  TThinkerIterator<AKey> it;
  double local_88;
  double dStack_80;
  DAngle local_78;
  AMColor local_70;
  DVector3 local_68;
  FThinkerIterator local_48;
  
  TThinkerIterator<AKey>::TThinkerIterator((TThinkerIterator<AKey> *)&local_48,0x80);
  while( true ) {
    key = (AInventory *)FThinkerIterator::Next(&local_48,false);
    if (key == (AInventory *)0x0) break;
    AActor::PosRelative(&local_68,(AActor *)key,MapPortalGroup);
    local_88 = local_68.X;
    dStack_80 = local_68.Y;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
      AM_rotatePoint(&local_88,&dStack_80);
      GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    }
    if (((key->super_AActor).flags.Value & 1) != 0) {
      uVar1 = P_GetMapColorForKey(key);
      if ((int)uVar1 < 0) {
        local_70 = AMColors.c[9];
      }
      else {
        AMColor::FromRGB(&local_70,uVar1 >> 0x10 & 0xff,uVar1 >> 8 & 0xff,uVar1 & 0xff);
      }
      local_78.Degrees = 0.0;
      AM_drawLineCharacter(EasyKey.Array,EasyKey.Count,0.0,&local_78,&local_70,local_88,dStack_80);
    }
  }
  return;
}

Assistant:

void AM_drawKeys ()
{
	AMColor color;
	mpoint_t p;
	DAngle	 angle;

	TThinkerIterator<AKey> it;
	AKey *key;

	while ((key = it.Next()) != NULL)
	{
		DVector3 pos = key->PosRelative(MapPortalGroup);
		p.x = pos.X;
		p.y = pos.Y;

		angle = key->Angles.Yaw;

		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&p.x, &p.y);
			angle += -players[consoleplayer].camera->Angles.Yaw + 90.;
		}

		if (key->flags & MF_SPECIAL)
		{
			// Find the key's own color.
			// Only works correctly if single-key locks have lower numbers than any-key locks.
			// That is the case for all default keys, however.
			int P_GetMapColorForKey (AInventory * key);
			int c = P_GetMapColorForKey(key);

			if (c >= 0)	color.FromRGB(RPART(c), GPART(c), BPART(c));
			else color = AMColors[AMColors.ThingColor_CountItem];
			AM_drawLineCharacter(&EasyKey[0], EasyKey.Size(), 0, 0., color, p.x, p.y);
		}
	}
}